

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv_async_t *handle;
  void **ppvVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  long *local_438;
  void *local_430;
  char buf [1024];
  
  if (&loop->async_io_watcher != w) {
    __assert_fail("w == &loop->async_io_watcher",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/async.c"
                  ,0x74,"void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  do {
    do {
      sVar7 = read(w->fd,buf,0x400);
    } while (sVar7 == 0x400);
    if (sVar7 != -1) goto LAB_0016c888;
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  if (*piVar8 != 0xb) {
    abort();
  }
LAB_0016c888:
  ppvVar1 = loop->async_handles;
  plVar2 = (long *)loop->async_handles[0];
  local_438 = (long *)&local_438;
  if (ppvVar1 != (void **)plVar2) {
    local_430 = loop->async_handles[1];
    *(long ***)local_430 = &local_438;
    plVar3 = (long *)plVar2[1];
    loop->async_handles[1] = plVar3;
    *plVar3 = (long)ppvVar1;
    local_438 = plVar2;
  }
  local_438[1] = (long)&local_438;
  while (plVar2 = local_438, &local_438 != (long **)local_438) {
    handle = (uv_async_t *)(local_438 + -0xd);
    lVar4 = *local_438;
    *(long *)local_438[1] = lVar4;
    *(long *)(lVar4 + 8) = local_438[1];
    *local_438 = (long)ppvVar1;
    puVar5 = (undefined8 *)loop->async_handles[1];
    plVar2[1] = (long)puVar5;
    *puVar5 = plVar2;
    loop->async_handles[1] = plVar2;
    iVar6 = uv__async_spin(handle);
    if ((iVar6 != 0) && ((code *)plVar2[-1] != (code *)0x0)) {
      (*(code *)plVar2[-1])(handle);
    }
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  char buf[1024];
  ssize_t r;
  QUEUE queue;
  QUEUE* q;
  uv_async_t* h;

  assert(w == &loop->async_io_watcher);

  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  QUEUE_MOVE(&loop->async_handles, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_async_t, queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->async_handles, q);

    if (0 == uv__async_spin(h))
      continue;  /* Not pending. */

    if (h->async_cb == NULL)
      continue;

    h->async_cb(h);
  }
}